

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix2d * tinyusdz::transpose(matrix2d *__return_storage_ptr__,matrix2d *_m)

{
  mat<double,_2,_2> *m_00;
  V *pVVar1;
  double *pdVar2;
  mat<double,_2,_2> local_70;
  undefined1 local_50 [8];
  matrix22d tm;
  matrix22d m;
  matrix2d *_m_local;
  
  linalg::mat<double,_2,_2>::mat((mat<double,_2,_2> *)&tm.y.y);
  linalg::mat<double,_2,_2>::mat((mat<double,_2,_2> *)local_50);
  pVVar1 = linalg::mat<double,_2,_2>::operator[]((mat<double,_2,_2> *)&tm.y.y,0);
  pdVar2 = linalg::vec<double,_2>::operator[](pVVar1,0);
  *pdVar2 = _m->m[0][0];
  pdVar2[1] = _m->m[0][1];
  m_00 = (mat<double,_2,_2> *)_m->m[1][0];
  pdVar2[2] = (double)m_00;
  pdVar2[3] = _m->m[1][1];
  linalg::transpose<double,2>(&local_70,(linalg *)&tm.y.y,m_00);
  local_50 = (undefined1  [8])local_70.x.x;
  tm.x.x = local_70.x.y;
  tm.x.y = local_70.y.x;
  tm.y.x = local_70.y.y;
  value::matrix2d::matrix2d(__return_storage_ptr__);
  pVVar1 = linalg::mat<double,_2,_2>::operator[]((mat<double,_2,_2> *)local_50,0);
  pdVar2 = linalg::vec<double,_2>::operator[](pVVar1,0);
  __return_storage_ptr__->m[0][0] = *pdVar2;
  __return_storage_ptr__->m[0][1] = pdVar2[1];
  __return_storage_ptr__->m[1][0] = pdVar2[2];
  __return_storage_ptr__->m[1][1] = pdVar2[3];
  return __return_storage_ptr__;
}

Assistant:

value::matrix2d transpose(const value::matrix2d &_m) {
  matrix22d m;
  matrix22d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 2 * 2);
  tm = linalg::transpose(m);

  value::matrix2d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 2 * 2);

  return dst;
}